

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_compress1X_usingCTable_internal_bmi2
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong *puVar8;
  uint uVar9;
  size_t sVar10;
  int iVar11;
  uint uVar12;
  byte *pbVar13;
  long lVar14;
  long lVar15;
  HUF_CStream_t bitC;
  HUF_CStream_t local_58;
  
  if (dstSize < 8) {
    return 0;
  }
  local_58.bitPos[0] = 0;
  local_58.bitPos[1] = 0;
  local_58.bitContainer[0] = 0;
  local_58.bitContainer[1] = 0;
  local_58.endPtr = (BYTE *)((long)dst + (dstSize - 8));
  if (dstSize == 8) {
    return 0;
  }
  uVar9 = (uint)*CTable;
  uVar12 = (uint)srcSize;
  local_58.ptr = (BYTE *)dst;
  local_58.startPtr = (BYTE *)dst;
  if (0xb < uVar9 || dstSize < ((*CTable & 0xffffffff) * srcSize >> 3) + 8) {
    uVar9 = uVar12 + 3;
    if (-1 < (int)uVar12) {
      uVar9 = uVar12;
    }
    iVar11 = uVar12 - (uVar9 & 0xfffffffc);
    if (0 < iVar11) {
      pbVar13 = (byte *)((long)(int)uVar12 + (long)src);
      iVar11 = iVar11 + 1;
      uVar5 = 0;
      do {
        pbVar13 = pbVar13 + -1;
        uVar7 = CTable[(ulong)*pbVar13 + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
        uVar5 = uVar5 + uVar7;
        local_58.bitContainer[0] =
             uVar7 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar7 & 0x3f);
        uVar7 = uVar5 & 0xff;
        if (0x40 < uVar7) goto LAB_0018f26d;
        srcSize = (size_t)((int)srcSize - 1);
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
      local_58.bitPos[0] = (size_t)((uint)uVar5 & 7);
      if (uVar7 == 0) goto LAB_0018f2ab;
      if (local_58.endPtr < dst) goto LAB_0018f2ca;
      local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)dst);
      if (local_58.endPtr < local_58.ptr) {
        local_58.ptr = local_58.endPtr;
      }
      *(size_t *)dst = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
    }
    if ((srcSize & 3) != 0) goto LAB_0018f346;
    if ((srcSize & 4) != 0) {
      lVar2 = (long)(int)srcSize;
      lVar14 = 3;
      sVar6 = local_58.bitPos[0];
      sVar10 = local_58.bitContainer[0];
      do {
        uVar5 = CTable[(ulong)*(byte *)((long)src + lVar14 + lVar2 + -4) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0018f28c;
        sVar6 = sVar6 + uVar5;
        if (0x40 < ((uint)sVar6 & 0xff)) goto LAB_0018f26d;
        sVar10 = sVar10 >> (uVar5 & 0x3f) | uVar5;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      uVar5 = CTable[(ulong)*(byte *)((long)src + lVar2 + -4) + 1];
      if (0xc < (uVar5 & 0xff)) goto LAB_0018f28c;
      uVar7 = sVar6 + uVar5;
      local_58.bitContainer[0] = uVar5 & 0xffffffffffffff00 | sVar10 >> (uVar5 & 0x3f);
      uVar5 = uVar7 & 0xff;
      if (0x40 < uVar5) goto LAB_0018f26d;
      local_58.bitPos[0] = (size_t)((uint)uVar7 & 7);
      if (uVar5 == 0) goto LAB_0018f2ab;
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2ca;
      srcSize = lVar2 - 4;
      puVar8 = (ulong *)((uVar5 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < puVar8) {
        puVar8 = (ulong *)local_58.endPtr;
      }
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f);
      local_58.ptr = (BYTE *)puVar8;
    }
    if ((srcSize & 7) == 0) {
      if (0 < (int)srcSize) {
        uVar5 = srcSize & 0xffffffff;
        lVar2 = (long)src + (uVar5 - 1);
        lVar14 = (long)src + (uVar5 - 5);
        do {
          lVar4 = 3;
          sVar6 = local_58.bitPos[0];
          sVar10 = local_58.bitContainer[0];
          do {
            uVar7 = CTable[(ulong)*(byte *)(lVar2 + -3 + lVar4) + 1];
            if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
            sVar6 = sVar6 + uVar7;
            if (0x40 < ((uint)sVar6 & 0xff)) goto LAB_0018f26d;
            sVar10 = sVar10 >> (uVar7 & 0x3f) | uVar7;
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
          uVar7 = CTable[(ulong)*(byte *)((uVar5 - 4) + (long)src) + 1];
          if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
          uVar3 = sVar6 + uVar7;
          local_58.bitContainer[0] = uVar7 & 0xffffffffffffff00 | sVar10 >> (uVar7 & 0x3f);
          uVar7 = uVar3 & 0xff;
          if (0x40 < uVar7) goto LAB_0018f26d;
          local_58.bitPos[0] = (size_t)((uint)uVar3 & 7);
          if (uVar7 == 0) goto LAB_0018f2ab;
          if (local_58.endPtr < local_58.ptr) goto LAB_0018f2ca;
          puVar8 = (ulong *)((uVar7 >> 3) + (long)local_58.ptr);
          if (local_58.endPtr < puVar8) {
            puVar8 = (ulong *)local_58.endPtr;
          }
          *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar3 & 0x3f);
          lVar4 = 3;
          lVar15 = 0;
          uVar7 = 0;
          do {
            uVar3 = CTable[(ulong)*(byte *)(lVar14 + -3 + lVar4) + 1];
            if (0xc < (uVar3 & 0xff)) goto LAB_0018f28c;
            lVar15 = lVar15 + uVar3;
            if (0x40 < ((uint)lVar15 & 0xff)) goto LAB_0018f26d;
            uVar7 = uVar7 >> (uVar3 & 0x3f) | uVar3;
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
          uVar3 = CTable[(ulong)*(byte *)((long)src + (uVar5 - 8)) + 1];
          if (0xc < (uVar3 & 0xff)) goto LAB_0018f28c;
          local_58.bitPos[1] = lVar15 + uVar3;
          local_58.bitContainer[1] = uVar3 & 0xffffffffffffff00 | uVar7 >> (uVar3 & 0x3f);
          if (0x40 < (local_58.bitPos[1] & 0xff)) goto LAB_0018f26d;
          if ((int)(local_58.bitPos[1] & 0xff) == 0x40) goto LAB_0018f327;
          local_58.bitContainer[0] =
               local_58.bitContainer[0] >> (local_58.bitPos[1] & 0x3f) | local_58.bitContainer[1];
          uVar3 = local_58.bitPos[1] + local_58.bitPos[0];
          uVar7 = uVar3 & 0xff;
          if (0x40 < uVar7) goto LAB_0018f308;
          local_58.bitPos[0] = (size_t)((uint)uVar3 & 7);
          if (uVar7 == 0) goto LAB_0018f2ab;
          local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)puVar8);
          if (local_58.endPtr < local_58.ptr) {
            local_58.ptr = local_58.endPtr;
          }
          *puVar8 = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar3 & 0x3f);
          srcSize = uVar5 - 8;
          lVar2 = lVar2 + -8;
          lVar14 = lVar14 + -8;
          bVar1 = 8 < (long)uVar5;
          uVar5 = srcSize;
        } while (bVar1);
      }
      goto LAB_0018f247;
    }
LAB_0018f365:
    __assert_fail("n % (2 * kUnroll) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3eb4,
                  "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                 );
  }
  switch(uVar9) {
  case 7:
    uVar9 = uVar12 + 7;
    if (-1 < (int)uVar12) {
      uVar9 = uVar12;
    }
    iVar11 = uVar12 - (uVar9 & 0xfffffff8);
    if (0 < iVar11) {
      pbVar13 = (byte *)((long)(int)uVar12 + (long)src);
      iVar11 = iVar11 + 1;
      uVar5 = 0;
      do {
        pbVar13 = pbVar13 + -1;
        uVar7 = CTable[(ulong)*pbVar13 + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
        uVar5 = uVar5 + uVar7;
        local_58.bitContainer[0] =
             uVar7 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar7 & 0x3f);
        uVar7 = uVar5 & 0xff;
        if (0x40 < uVar7) goto LAB_0018f26d;
        srcSize = (size_t)((int)srcSize - 1);
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
      local_58.bitPos[0] = (size_t)((uint)uVar5 & 7);
      if (uVar7 == 0) goto LAB_0018f2ab;
      if (local_58.endPtr < dst) goto LAB_0018f2ca;
      *(size_t *)dst = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
      local_58.ptr = (BYTE *)((long)dst + (uVar7 >> 3));
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
    }
    if ((srcSize & 7) != 0) goto LAB_0018f346;
    if ((srcSize & 8) != 0) {
      lVar2 = (long)(int)srcSize;
      lVar14 = 7;
      sVar6 = local_58.bitPos[0];
      sVar10 = local_58.bitContainer[0];
      do {
        uVar5 = CTable[(ulong)*(byte *)((long)src + lVar14 + lVar2 + -8) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0018f28c;
        sVar6 = sVar6 + uVar5;
        if (0x40 < ((uint)sVar6 & 0xff)) goto LAB_0018f26d;
        sVar10 = sVar10 >> (uVar5 & 0x3f) | uVar5;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      uVar5 = CTable[(ulong)*(byte *)((long)src + lVar2 + -8) + 1];
      if (0xc < (uVar5 & 0xff)) {
LAB_0018f28c:
        __assert_fail("HUF_getNbBits(elt) <= HUF_TABLELOG_ABSOLUTEMAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e2b,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
      }
      uVar7 = sVar6 + uVar5;
      local_58.bitContainer[0] = uVar5 & 0xffffffffffffff00 | sVar10 >> (uVar5 & 0x3f);
      uVar5 = uVar7 & 0xff;
      if (0x40 < uVar5) {
LAB_0018f26d:
        __assert_fail("(bitC->bitPos[idx] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e37,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
      }
      local_58.bitPos[0] = (size_t)((uint)uVar7 & 7);
      if (uVar5 == 0) {
LAB_0018f2ab:
        __assert_fail("nbBits > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e6d,"void HUF_flushBits(HUF_CStream_t *, int)");
      }
      if (local_58.endPtr < local_58.ptr) {
LAB_0018f2ca:
        __assert_fail("bitC->ptr <= bitC->endPtr",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e6f,"void HUF_flushBits(HUF_CStream_t *, int)");
      }
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f);
      local_58.ptr = (BYTE *)((uVar5 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) {
LAB_0018f2e9:
        __assert_fail("!kFast || bitC->ptr <= bitC->endPtr",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e72,"void HUF_flushBits(HUF_CStream_t *, int)");
      }
      srcSize = lVar2 - 8;
    }
    if ((srcSize & 0xf) != 0) goto LAB_0018f365;
    if (0 < (int)srcSize) {
      uVar5 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar5 - 1);
      lVar14 = (long)src + (uVar5 - 9);
      do {
        lVar4 = 7;
        sVar6 = local_58.bitPos[0];
        sVar10 = local_58.bitContainer[0];
        do {
          uVar7 = CTable[(ulong)*(byte *)(lVar2 + -7 + lVar4) + 1];
          if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
          sVar6 = sVar6 + uVar7;
          if (0x40 < ((uint)sVar6 & 0xff)) goto LAB_0018f26d;
          sVar10 = sVar10 >> (uVar7 & 0x3f) | uVar7;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar7 = CTable[(ulong)*(byte *)((uVar5 - 8) + (long)src) + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
        uVar3 = sVar6 + uVar7;
        local_58.bitContainer[0] = uVar7 & 0xffffffffffffff00 | sVar10 >> (uVar7 & 0x3f);
        uVar7 = uVar3 & 0xff;
        if (0x40 < uVar7) goto LAB_0018f26d;
        local_58.bitPos[0] = (size_t)((uint)uVar3 & 7);
        if (uVar7 == 0) goto LAB_0018f2ab;
        if (local_58.endPtr < local_58.ptr) goto LAB_0018f2ca;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar3 & 0x3f);
        puVar8 = (ulong *)((uVar7 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < puVar8) goto LAB_0018f2e9;
        lVar4 = 7;
        lVar15 = 0;
        uVar7 = 0;
        do {
          uVar3 = CTable[(ulong)*(byte *)(lVar14 + -7 + lVar4) + 1];
          if (0xc < (uVar3 & 0xff)) goto LAB_0018f28c;
          lVar15 = lVar15 + uVar3;
          if (0x40 < ((uint)lVar15 & 0xff)) goto LAB_0018f26d;
          uVar7 = uVar7 >> (uVar3 & 0x3f) | uVar3;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar3 = CTable[(ulong)*(byte *)((long)src + (uVar5 - 0x10)) + 1];
        if (0xc < (uVar3 & 0xff)) goto LAB_0018f28c;
        local_58.bitPos[1] = lVar15 + uVar3;
        local_58.bitContainer[1] = uVar3 & 0xffffffffffffff00 | uVar7 >> (uVar3 & 0x3f);
        if (0x40 < (local_58.bitPos[1] & 0xff)) goto LAB_0018f26d;
        if ((int)(local_58.bitPos[1] & 0xff) == 0x40) {
LAB_0018f327:
          __assert_fail("(bitC->bitPos[1] & 0xFF) < HUF_BITS_IN_CONTAINER",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3e56,"void HUF_mergeIndex1(HUF_CStream_t *)");
        }
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> (local_58.bitPos[1] & 0x3f) | local_58.bitContainer[1];
        uVar3 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar7 = uVar3 & 0xff;
        if (0x40 < uVar7) {
LAB_0018f308:
          __assert_fail("(bitC->bitPos[0] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3e5a,"void HUF_mergeIndex1(HUF_CStream_t *)");
        }
        local_58.bitPos[0] = (size_t)((uint)uVar3 & 7);
        if (uVar7 == 0) goto LAB_0018f2ab;
        *puVar8 = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar3 & 0x3f);
        local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)puVar8);
        if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
        srcSize = uVar5 - 0x10;
        lVar2 = lVar2 + -0x10;
        lVar14 = lVar14 + -0x10;
        bVar1 = 0x10 < (long)uVar5;
        uVar5 = srcSize;
      } while (bVar1);
    }
    break;
  case 8:
    if (0 < (int)uVar12 % 7) {
      pbVar13 = (byte *)((long)(int)uVar12 + (long)src);
      iVar11 = (int)uVar12 % 7 + 1;
      uVar5 = 0;
      do {
        pbVar13 = pbVar13 + -1;
        uVar7 = CTable[(ulong)*pbVar13 + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
        uVar5 = uVar5 + uVar7;
        local_58.bitContainer[0] =
             uVar7 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar7 & 0x3f);
        uVar7 = uVar5 & 0xff;
        if (0x40 < uVar7) goto LAB_0018f26d;
        srcSize = (size_t)((int)srcSize - 1);
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
      local_58.bitPos[0] = (size_t)((uint)uVar5 & 7);
      if (uVar7 == 0) goto LAB_0018f2ab;
      if (local_58.endPtr < dst) goto LAB_0018f2ca;
      *(size_t *)dst = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
      local_58.ptr = (BYTE *)((long)dst + (uVar7 >> 3));
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
    }
    iVar11 = (int)srcSize;
    uVar12 = iVar11 * -0x49249249 + 0x12492492;
    if (uVar12 < 0x24924925) {
      if (0x12492492 < (uVar12 >> 1 | iVar11 * -0x80000000)) {
        lVar2 = (long)iVar11;
        lVar14 = 6;
        sVar6 = local_58.bitPos[0];
        sVar10 = local_58.bitContainer[0];
        do {
          uVar5 = CTable[(ulong)*(byte *)((long)src + lVar14 + lVar2 + -7) + 1];
          if (0xc < (uVar5 & 0xff)) goto LAB_0018f28c;
          sVar6 = sVar6 + uVar5;
          if (0x40 < ((uint)sVar6 & 0xff)) goto LAB_0018f26d;
          sVar10 = sVar10 >> (uVar5 & 0x3f) | uVar5;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
        uVar5 = CTable[(ulong)*(byte *)((long)src + lVar2 + -7) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0018f28c;
        uVar7 = sVar6 + uVar5;
        local_58.bitContainer[0] = uVar5 & 0xffffffffffffff00 | sVar10 >> (uVar5 & 0x3f);
        uVar5 = uVar7 & 0xff;
        if (0x40 < uVar5) goto LAB_0018f26d;
        local_58.bitPos[0] = (size_t)((uint)uVar7 & 7);
        if (uVar5 == 0) goto LAB_0018f2ab;
        if (local_58.endPtr < local_58.ptr) goto LAB_0018f2ca;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f);
        local_58.ptr = (BYTE *)((uVar5 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
        srcSize = lVar2 - 7;
      }
      iVar11 = (int)srcSize;
      if ((iVar11 * -0x49249249 + 0x12492492U >> 1 | iVar11 * -0x80000000) < 0x12492493) {
        if (0 < iVar11) {
          uVar5 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar5 - 1);
          lVar14 = (long)src + (uVar5 - 8);
          do {
            lVar4 = 6;
            sVar6 = local_58.bitPos[0];
            sVar10 = local_58.bitContainer[0];
            do {
              uVar7 = CTable[(ulong)*(byte *)(lVar2 + -6 + lVar4) + 1];
              if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
              sVar6 = sVar6 + uVar7;
              if (0x40 < ((uint)sVar6 & 0xff)) goto LAB_0018f26d;
              sVar10 = sVar10 >> (uVar7 & 0x3f) | uVar7;
              lVar4 = lVar4 + -1;
            } while (lVar4 != 0);
            uVar7 = CTable[(ulong)*(byte *)((uVar5 - 7) + (long)src) + 1];
            if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
            uVar3 = sVar6 + uVar7;
            local_58.bitContainer[0] = uVar7 & 0xffffffffffffff00 | sVar10 >> (uVar7 & 0x3f);
            uVar7 = uVar3 & 0xff;
            if (0x40 < uVar7) goto LAB_0018f26d;
            local_58.bitPos[0] = (size_t)((uint)uVar3 & 7);
            if (uVar7 == 0) goto LAB_0018f2ab;
            if (local_58.endPtr < local_58.ptr) goto LAB_0018f2ca;
            *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar3 & 0x3f)
            ;
            puVar8 = (ulong *)((uVar7 >> 3) + (long)local_58.ptr);
            if (local_58.endPtr < puVar8) goto LAB_0018f2e9;
            lVar4 = 6;
            lVar15 = 0;
            uVar7 = 0;
            do {
              uVar3 = CTable[(ulong)*(byte *)(lVar14 + -6 + lVar4) + 1];
              if (0xc < (uVar3 & 0xff)) goto LAB_0018f28c;
              lVar15 = lVar15 + uVar3;
              if (0x40 < ((uint)lVar15 & 0xff)) goto LAB_0018f26d;
              uVar7 = uVar7 >> (uVar3 & 0x3f) | uVar3;
              lVar4 = lVar4 + -1;
            } while (lVar4 != 0);
            uVar3 = CTable[(ulong)*(byte *)((long)src + (uVar5 - 0xe)) + 1];
            if (0xc < (uVar3 & 0xff)) goto LAB_0018f28c;
            local_58.bitPos[1] = lVar15 + uVar3;
            local_58.bitContainer[1] = uVar3 & 0xffffffffffffff00 | uVar7 >> (uVar3 & 0x3f);
            if (0x40 < (local_58.bitPos[1] & 0xff)) goto LAB_0018f26d;
            if ((int)(local_58.bitPos[1] & 0xff) == 0x40) goto LAB_0018f327;
            local_58.bitContainer[0] =
                 local_58.bitContainer[0] >> (local_58.bitPos[1] & 0x3f) | local_58.bitContainer[1];
            uVar3 = local_58.bitPos[1] + local_58.bitPos[0];
            uVar7 = uVar3 & 0xff;
            if (0x40 < uVar7) goto LAB_0018f308;
            local_58.bitPos[0] = (size_t)((uint)uVar3 & 7);
            if (uVar7 == 0) goto LAB_0018f2ab;
            *puVar8 = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar3 & 0x3f);
            local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)puVar8);
            if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
            srcSize = uVar5 - 0xe;
            lVar2 = lVar2 + -0xe;
            lVar14 = lVar14 + -0xe;
            bVar1 = 0xe < (long)uVar5;
            uVar5 = srcSize;
          } while (bVar1);
        }
        break;
      }
      goto LAB_0018f365;
    }
LAB_0018f346:
    __assert_fail("n % kUnroll == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3ea8,
                  "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                 );
  case 9:
    if (0 < (int)uVar12 % 6) {
      pbVar13 = (byte *)((long)(int)uVar12 + (long)src);
      iVar11 = (int)uVar12 % 6 + 1;
      uVar5 = 0;
      do {
        pbVar13 = pbVar13 + -1;
        uVar7 = CTable[(ulong)*pbVar13 + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
        uVar5 = uVar5 + uVar7;
        local_58.bitContainer[0] =
             uVar7 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar7 & 0x3f);
        uVar7 = uVar5 & 0xff;
        if (0x40 < uVar7) goto LAB_0018f26d;
        srcSize = (size_t)((int)srcSize - 1);
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
      local_58.bitPos[0] = (size_t)((uint)uVar5 & 7);
      if (uVar7 == 0) goto LAB_0018f2ab;
      if (local_58.endPtr < dst) goto LAB_0018f2ca;
      *(size_t *)dst = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
      local_58.ptr = (BYTE *)((long)dst + (uVar7 >> 3));
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
    }
    iVar11 = (int)srcSize;
    if (0x2aaaaaaa < (iVar11 * -0x55555555 + 0x2aaaaaaaU >> 1 | iVar11 * -0x80000000))
    goto LAB_0018f346;
    if (0x15555554 < (iVar11 * -0x55555555 + 0x2aaaaaa8U >> 2 | iVar11 * -0x40000000)) {
      lVar2 = (long)iVar11;
      lVar14 = 5;
      sVar6 = local_58.bitPos[0];
      sVar10 = local_58.bitContainer[0];
      do {
        uVar5 = CTable[(ulong)*(byte *)((long)src + lVar14 + lVar2 + -6) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0018f28c;
        sVar6 = sVar6 + uVar5;
        if (0x40 < ((uint)sVar6 & 0xff)) goto LAB_0018f26d;
        sVar10 = sVar10 >> (uVar5 & 0x3f) | uVar5;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      uVar5 = CTable[(ulong)*(byte *)((long)src + lVar2 + -6) + 1];
      if (0xc < (uVar5 & 0xff)) goto LAB_0018f28c;
      uVar7 = sVar6 + uVar5;
      local_58.bitContainer[0] = uVar5 & 0xffffffffffffff00 | sVar10 >> (uVar5 & 0x3f);
      uVar5 = uVar7 & 0xff;
      if (0x40 < uVar5) goto LAB_0018f26d;
      local_58.bitPos[0] = (size_t)((uint)uVar7 & 7);
      if (uVar5 == 0) goto LAB_0018f2ab;
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2ca;
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f);
      local_58.ptr = (BYTE *)((uVar5 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
      srcSize = lVar2 - 6;
    }
    iVar11 = (int)srcSize;
    if (0x15555554 < (iVar11 * -0x55555555 + 0x2aaaaaa8U >> 2 | iVar11 * -0x40000000))
    goto LAB_0018f365;
    if (0 < iVar11) {
      uVar5 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar5 - 1);
      lVar14 = (long)src + (uVar5 - 7);
      do {
        lVar4 = 5;
        sVar6 = local_58.bitPos[0];
        sVar10 = local_58.bitContainer[0];
        do {
          uVar7 = CTable[(ulong)*(byte *)(lVar2 + -5 + lVar4) + 1];
          if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
          sVar6 = sVar6 + uVar7;
          if (0x40 < ((uint)sVar6 & 0xff)) goto LAB_0018f26d;
          sVar10 = sVar10 >> (uVar7 & 0x3f) | uVar7;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar7 = CTable[(ulong)*(byte *)((uVar5 - 6) + (long)src) + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
        uVar3 = sVar6 + uVar7;
        local_58.bitContainer[0] = uVar7 & 0xffffffffffffff00 | sVar10 >> (uVar7 & 0x3f);
        uVar7 = uVar3 & 0xff;
        if (0x40 < uVar7) goto LAB_0018f26d;
        local_58.bitPos[0] = (size_t)((uint)uVar3 & 7);
        if (uVar7 == 0) goto LAB_0018f2ab;
        if (local_58.endPtr < local_58.ptr) goto LAB_0018f2ca;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar3 & 0x3f);
        puVar8 = (ulong *)((uVar7 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < puVar8) goto LAB_0018f2e9;
        lVar4 = 5;
        lVar15 = 0;
        uVar7 = 0;
        do {
          uVar3 = CTable[(ulong)*(byte *)(lVar14 + -5 + lVar4) + 1];
          if (0xc < (uVar3 & 0xff)) goto LAB_0018f28c;
          lVar15 = lVar15 + uVar3;
          if (0x40 < ((uint)lVar15 & 0xff)) goto LAB_0018f26d;
          uVar7 = uVar7 >> (uVar3 & 0x3f) | uVar3;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar3 = CTable[(ulong)*(byte *)((long)src + (uVar5 - 0xc)) + 1];
        if (0xc < (uVar3 & 0xff)) goto LAB_0018f28c;
        local_58.bitPos[1] = lVar15 + uVar3;
        local_58.bitContainer[1] = uVar3 & 0xffffffffffffff00 | uVar7 >> (uVar3 & 0x3f);
        if (0x40 < (local_58.bitPos[1] & 0xff)) goto LAB_0018f26d;
        if ((int)(local_58.bitPos[1] & 0xff) == 0x40) goto LAB_0018f327;
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> (local_58.bitPos[1] & 0x3f) | local_58.bitContainer[1];
        uVar3 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar7 = uVar3 & 0xff;
        if (0x40 < uVar7) goto LAB_0018f308;
        local_58.bitPos[0] = (size_t)((uint)uVar3 & 7);
        if (uVar7 == 0) goto LAB_0018f2ab;
        *puVar8 = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar3 & 0x3f);
        local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)puVar8);
        if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
        srcSize = uVar5 - 0xc;
        lVar2 = lVar2 + -0xc;
        lVar14 = lVar14 + -0xc;
        bVar1 = 0xc < (long)uVar5;
        uVar5 = srcSize;
      } while (bVar1);
    }
    break;
  case 10:
    if (0 < (int)uVar12 % 5) {
      pbVar13 = (byte *)((long)(int)uVar12 + (long)src);
      iVar11 = (int)uVar12 % 5 + 1;
      uVar5 = 0;
      do {
        pbVar13 = pbVar13 + -1;
        uVar7 = CTable[(ulong)*pbVar13 + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
        uVar5 = uVar5 + uVar7;
        local_58.bitContainer[0] =
             uVar7 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar7 & 0x3f);
        uVar7 = uVar5 & 0xff;
        if (0x40 < uVar7) goto LAB_0018f26d;
        srcSize = (size_t)((int)srcSize - 1);
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
      local_58.bitPos[0] = (size_t)((uint)uVar5 & 7);
      if (uVar7 == 0) goto LAB_0018f2ab;
      if (local_58.endPtr < dst) goto LAB_0018f2ca;
      *(size_t *)dst = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
      local_58.ptr = (BYTE *)((long)dst + (uVar7 >> 3));
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
    }
    iVar11 = (int)srcSize;
    if (0x33333332 < iVar11 * -0x33333333 + 0x19999999U) goto LAB_0018f346;
    if (0x19999998 < (iVar11 * -0x33333333 + 0x19999998U >> 1 | iVar11 * -0x80000000)) {
      lVar2 = (long)iVar11;
      lVar14 = 4;
      sVar6 = local_58.bitPos[0];
      sVar10 = local_58.bitContainer[0];
      do {
        uVar5 = CTable[(ulong)*(byte *)((long)src + lVar14 + lVar2 + -5) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0018f28c;
        sVar6 = sVar6 + uVar5;
        if (0x40 < ((uint)sVar6 & 0xff)) goto LAB_0018f26d;
        sVar10 = sVar10 >> (uVar5 & 0x3f) | uVar5;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      uVar5 = CTable[(ulong)*(byte *)((long)src + lVar2 + -5) + 1];
      if (0xc < (uVar5 & 0xff)) goto LAB_0018f28c;
      local_58.bitContainer[0] = sVar10 >> (uVar5 & 0x3f) | uVar5;
      uVar5 = sVar6 + uVar5;
      uVar7 = uVar5 & 0xff;
      if (0x40 < uVar7) goto LAB_0018f26d;
      local_58.bitPos[0] = (size_t)((uint)uVar5 & 7);
      if (uVar7 == 0) goto LAB_0018f2ab;
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2ca;
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
      local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
      srcSize = lVar2 - 5;
    }
    iVar11 = (int)srcSize;
    if (0x19999998 < (iVar11 * -0x33333333 + 0x19999998U >> 1 | iVar11 * -0x80000000))
    goto LAB_0018f365;
    if (0 < iVar11) {
      uVar5 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar5 - 1);
      lVar14 = (long)src + (uVar5 - 6);
      do {
        lVar4 = 4;
        sVar6 = local_58.bitPos[0];
        sVar10 = local_58.bitContainer[0];
        do {
          uVar7 = CTable[(ulong)*(byte *)(lVar2 + -4 + lVar4) + 1];
          if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
          sVar6 = sVar6 + uVar7;
          if (0x40 < ((uint)sVar6 & 0xff)) goto LAB_0018f26d;
          sVar10 = sVar10 >> (uVar7 & 0x3f) | uVar7;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar7 = CTable[(ulong)*(byte *)((uVar5 - 5) + (long)src) + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
        local_58.bitContainer[0] = sVar10 >> (uVar7 & 0x3f) | uVar7;
        uVar7 = sVar6 + uVar7;
        uVar3 = uVar7 & 0xff;
        if (0x40 < uVar3) goto LAB_0018f26d;
        local_58.bitPos[0] = (size_t)((uint)uVar7 & 7);
        if (uVar3 == 0) goto LAB_0018f2ab;
        if (local_58.endPtr < local_58.ptr) goto LAB_0018f2ca;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f);
        puVar8 = (ulong *)((uVar3 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < puVar8) goto LAB_0018f2e9;
        lVar4 = 4;
        lVar15 = 0;
        uVar7 = 0;
        do {
          uVar3 = CTable[(ulong)*(byte *)(lVar14 + -4 + lVar4) + 1];
          if (0xc < (uVar3 & 0xff)) goto LAB_0018f28c;
          lVar15 = lVar15 + uVar3;
          if (0x40 < ((uint)lVar15 & 0xff)) goto LAB_0018f26d;
          uVar7 = uVar7 >> (uVar3 & 0x3f) | uVar3;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar3 = CTable[(ulong)*(byte *)((long)src + (uVar5 - 10)) + 1];
        if (0xc < (uVar3 & 0xff)) goto LAB_0018f28c;
        local_58.bitContainer[1] = uVar7 >> (uVar3 & 0x3f) | uVar3;
        local_58.bitPos[1] = lVar15 + uVar3;
        if (0x40 < (local_58.bitPos[1] & 0xff)) goto LAB_0018f26d;
        if ((int)(local_58.bitPos[1] & 0xff) == 0x40) goto LAB_0018f327;
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> (local_58.bitPos[1] & 0x3f) | local_58.bitContainer[1];
        uVar3 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar7 = uVar3 & 0xff;
        if (0x40 < uVar7) goto LAB_0018f308;
        local_58.bitPos[0] = (size_t)((uint)uVar3 & 7);
        if (uVar7 == 0) goto LAB_0018f2ab;
        *puVar8 = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar3 & 0x3f);
        local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)puVar8);
        if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
        srcSize = uVar5 - 10;
        lVar2 = lVar2 + -10;
        lVar14 = lVar14 + -10;
        bVar1 = 10 < (long)uVar5;
        uVar5 = srcSize;
      } while (bVar1);
    }
    break;
  case 0xb:
    if (0 < (int)uVar12 % 5) {
      pbVar13 = (byte *)((long)(int)uVar12 + (long)src);
      iVar11 = (int)uVar12 % 5 + 1;
      uVar5 = 0;
      do {
        pbVar13 = pbVar13 + -1;
        uVar7 = CTable[(ulong)*pbVar13 + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
        uVar5 = uVar5 + uVar7;
        local_58.bitContainer[0] =
             uVar7 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar7 & 0x3f);
        uVar7 = uVar5 & 0xff;
        if (0x40 < uVar7) goto LAB_0018f26d;
        srcSize = (size_t)((int)srcSize - 1);
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
      local_58.bitPos[0] = (size_t)((uint)uVar5 & 7);
      if (uVar7 == 0) goto LAB_0018f2ab;
      if (local_58.endPtr < dst) goto LAB_0018f2ca;
      *(size_t *)dst = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
      local_58.ptr = (BYTE *)((long)dst + (uVar7 >> 3));
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
    }
    iVar11 = (int)srcSize;
    if (0x33333332 < iVar11 * -0x33333333 + 0x19999999U) goto LAB_0018f346;
    if (0x19999998 < (iVar11 * -0x33333333 + 0x19999998U >> 1 | iVar11 * -0x80000000)) {
      lVar2 = (long)iVar11;
      lVar14 = 4;
      sVar6 = local_58.bitPos[0];
      sVar10 = local_58.bitContainer[0];
      do {
        uVar5 = CTable[(ulong)*(byte *)((long)src + lVar14 + lVar2 + -5) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0018f28c;
        sVar6 = sVar6 + uVar5;
        if (0x40 < ((uint)sVar6 & 0xff)) goto LAB_0018f26d;
        sVar10 = sVar10 >> (uVar5 & 0x3f) | uVar5;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      uVar5 = CTable[(ulong)*(byte *)((long)src + lVar2 + -5) + 1];
      if (0xc < (uVar5 & 0xff)) goto LAB_0018f28c;
      uVar7 = sVar6 + uVar5;
      local_58.bitContainer[0] = uVar5 & 0xffffffffffffff00 | sVar10 >> (uVar5 & 0x3f);
      uVar5 = uVar7 & 0xff;
      if (0x40 < uVar5) goto LAB_0018f26d;
      local_58.bitPos[0] = (size_t)((uint)uVar7 & 7);
      if (uVar5 == 0) goto LAB_0018f2ab;
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2ca;
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f);
      local_58.ptr = (BYTE *)((uVar5 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
      srcSize = lVar2 - 5;
    }
    iVar11 = (int)srcSize;
    if (0x19999998 < (iVar11 * -0x33333333 + 0x19999998U >> 1 | iVar11 * -0x80000000))
    goto LAB_0018f365;
    if (0 < iVar11) {
      uVar5 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar5 - 1);
      lVar14 = (long)src + (uVar5 - 6);
      do {
        lVar4 = 4;
        sVar6 = local_58.bitPos[0];
        sVar10 = local_58.bitContainer[0];
        do {
          uVar7 = CTable[(ulong)*(byte *)(lVar2 + -4 + lVar4) + 1];
          if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
          sVar6 = sVar6 + uVar7;
          if (0x40 < ((uint)sVar6 & 0xff)) goto LAB_0018f26d;
          sVar10 = sVar10 >> (uVar7 & 0x3f) | uVar7;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar7 = CTable[(ulong)*(byte *)((uVar5 - 5) + (long)src) + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
        uVar3 = sVar6 + uVar7;
        local_58.bitContainer[0] = uVar7 & 0xffffffffffffff00 | sVar10 >> (uVar7 & 0x3f);
        uVar7 = uVar3 & 0xff;
        if (0x40 < uVar7) goto LAB_0018f26d;
        local_58.bitPos[0] = (size_t)((uint)uVar3 & 7);
        if (uVar7 == 0) goto LAB_0018f2ab;
        if (local_58.endPtr < local_58.ptr) goto LAB_0018f2ca;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar3 & 0x3f);
        puVar8 = (ulong *)((uVar7 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < puVar8) goto LAB_0018f2e9;
        lVar4 = 4;
        lVar15 = 0;
        uVar7 = 0;
        do {
          uVar3 = CTable[(ulong)*(byte *)(lVar14 + -4 + lVar4) + 1];
          if (0xc < (uVar3 & 0xff)) goto LAB_0018f28c;
          lVar15 = lVar15 + uVar3;
          if (0x40 < ((uint)lVar15 & 0xff)) goto LAB_0018f26d;
          uVar7 = uVar7 >> (uVar3 & 0x3f) | uVar3;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar3 = CTable[(ulong)*(byte *)((long)src + (uVar5 - 10)) + 1];
        if (0xc < (uVar3 & 0xff)) goto LAB_0018f28c;
        local_58.bitPos[1] = lVar15 + uVar3;
        local_58.bitContainer[1] = uVar3 & 0xffffffffffffff00 | uVar7 >> (uVar3 & 0x3f);
        if (0x40 < (local_58.bitPos[1] & 0xff)) goto LAB_0018f26d;
        if ((int)(local_58.bitPos[1] & 0xff) == 0x40) goto LAB_0018f327;
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> (local_58.bitPos[1] & 0x3f) | local_58.bitContainer[1];
        uVar3 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar7 = uVar3 & 0xff;
        if (0x40 < uVar7) goto LAB_0018f308;
        local_58.bitPos[0] = (size_t)((uint)uVar3 & 7);
        if (uVar7 == 0) goto LAB_0018f2ab;
        *puVar8 = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar3 & 0x3f);
        local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)puVar8);
        if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
        srcSize = uVar5 - 10;
        lVar2 = lVar2 + -10;
        lVar14 = lVar14 + -10;
        bVar1 = 10 < (long)uVar5;
        uVar5 = srcSize;
      } while (bVar1);
    }
    break;
  default:
    if (0 < (int)uVar12 % 9) {
      pbVar13 = (byte *)((long)(int)uVar12 + (long)src);
      iVar11 = (int)uVar12 % 9 + 1;
      uVar5 = 0;
      do {
        pbVar13 = pbVar13 + -1;
        uVar7 = CTable[(ulong)*pbVar13 + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
        uVar5 = uVar5 + uVar7;
        local_58.bitContainer[0] =
             uVar7 & 0xffffffffffffff00 | local_58.bitContainer[0] >> (uVar7 & 0x3f);
        uVar7 = uVar5 & 0xff;
        if (0x40 < uVar7) goto LAB_0018f26d;
        srcSize = (size_t)((int)srcSize - 1);
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
      local_58.bitPos[0] = (size_t)((uint)uVar5 & 7);
      if (uVar7 == 0) goto LAB_0018f2ab;
      if (local_58.endPtr < dst) goto LAB_0018f2ca;
      *(size_t *)dst = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
      local_58.ptr = (BYTE *)((long)dst + (uVar7 >> 3));
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
    }
    iVar11 = (int)srcSize;
    uVar12 = iVar11 * 0x38e38e39 + 0xe38e38e;
    if (0x1c71c71c < uVar12) goto LAB_0018f346;
    if (0xe38e38e < (uVar12 >> 1 | iVar11 * -0x80000000)) {
      lVar2 = (long)iVar11;
      lVar14 = 8;
      sVar6 = local_58.bitPos[0];
      sVar10 = local_58.bitContainer[0];
      do {
        uVar5 = CTable[(ulong)*(byte *)((long)src + lVar14 + lVar2 + -9) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0018f28c;
        sVar6 = sVar6 + uVar5;
        if (0x40 < ((uint)sVar6 & 0xff)) goto LAB_0018f26d;
        sVar10 = sVar10 >> (uVar5 & 0x3f) | uVar5;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      uVar5 = CTable[(ulong)*(byte *)((long)src + lVar2 + -9) + 1];
      if (0xc < (uVar5 & 0xff)) goto LAB_0018f28c;
      local_58.bitContainer[0] = sVar10 >> (uVar5 & 0x3f) | uVar5;
      uVar5 = sVar6 + uVar5;
      uVar7 = uVar5 & 0xff;
      if (0x40 < uVar7) goto LAB_0018f26d;
      local_58.bitPos[0] = (size_t)((uint)uVar5 & 7);
      if (uVar7 == 0) goto LAB_0018f2ab;
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2ca;
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
      local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
      srcSize = lVar2 - 9;
    }
    iVar11 = (int)srcSize;
    if (0xe38e38e < (iVar11 * 0x38e38e39 + 0xe38e38eU >> 1 | iVar11 * -0x80000000))
    goto LAB_0018f365;
    if (0 < iVar11) {
      uVar5 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar5 - 1);
      lVar14 = (long)src + (uVar5 - 10);
      do {
        lVar4 = 8;
        sVar6 = local_58.bitPos[0];
        sVar10 = local_58.bitContainer[0];
        do {
          uVar7 = CTable[(ulong)*(byte *)(lVar2 + -8 + lVar4) + 1];
          if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
          sVar6 = sVar6 + uVar7;
          if (0x40 < ((uint)sVar6 & 0xff)) goto LAB_0018f26d;
          sVar10 = sVar10 >> (uVar7 & 0x3f) | uVar7;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar7 = CTable[(ulong)*(byte *)((uVar5 - 9) + (long)src) + 1];
        if (0xc < (uVar7 & 0xff)) goto LAB_0018f28c;
        local_58.bitContainer[0] = sVar10 >> (uVar7 & 0x3f) | uVar7;
        uVar7 = sVar6 + uVar7;
        uVar3 = uVar7 & 0xff;
        if (0x40 < uVar3) goto LAB_0018f26d;
        local_58.bitPos[0] = (size_t)((uint)uVar7 & 7);
        if (uVar3 == 0) goto LAB_0018f2ab;
        if (local_58.endPtr < local_58.ptr) goto LAB_0018f2ca;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f);
        puVar8 = (ulong *)((uVar3 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < puVar8) goto LAB_0018f2e9;
        lVar4 = 8;
        lVar15 = 0;
        uVar7 = 0;
        do {
          uVar3 = CTable[(ulong)*(byte *)(lVar14 + -8 + lVar4) + 1];
          if (0xc < (uVar3 & 0xff)) goto LAB_0018f28c;
          lVar15 = lVar15 + uVar3;
          if (0x40 < ((uint)lVar15 & 0xff)) goto LAB_0018f26d;
          uVar7 = uVar7 >> (uVar3 & 0x3f) | uVar3;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar3 = CTable[(ulong)*(byte *)((long)src + (uVar5 - 0x12)) + 1];
        if (0xc < (uVar3 & 0xff)) goto LAB_0018f28c;
        local_58.bitContainer[1] = uVar7 >> (uVar3 & 0x3f) | uVar3;
        local_58.bitPos[1] = lVar15 + uVar3;
        if (0x40 < (local_58.bitPos[1] & 0xff)) goto LAB_0018f26d;
        if ((int)(local_58.bitPos[1] & 0xff) == 0x40) goto LAB_0018f327;
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> (local_58.bitPos[1] & 0x3f) | local_58.bitContainer[1];
        uVar3 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar7 = uVar3 & 0xff;
        if (0x40 < uVar7) goto LAB_0018f308;
        local_58.bitPos[0] = (size_t)((uint)uVar3 & 7);
        if (uVar7 == 0) goto LAB_0018f2ab;
        *puVar8 = local_58.bitContainer[0] >> ((ulong)(byte)-(char)uVar3 & 0x3f);
        local_58.ptr = (BYTE *)((uVar7 >> 3) + (long)puVar8);
        if (local_58.endPtr < local_58.ptr) goto LAB_0018f2e9;
        srcSize = uVar5 - 0x12;
        lVar2 = lVar2 + -0x12;
        lVar14 = lVar14 + -0x12;
        bVar1 = 0x12 < (long)uVar5;
        uVar5 = srcSize;
      } while (bVar1);
    }
  }
LAB_0018f247:
  if ((int)srcSize != 0) {
    __assert_fail("n == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3ecb,
                  "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                 );
  }
  if (local_58.endPtr < local_58.ptr) {
    __assert_fail("bitC.ptr <= bitC.endPtr",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3f16,
                  "size_t HUF_compress1X_usingCTable_internal_body(void *, size_t, const void *, size_t, const HUF_CElt *)"
                 );
  }
  sVar6 = HUF_closeCStream(&local_58);
  return sVar6;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    U32 const tableLog = (U32)CTable[0];
    HUF_CElt const* ct = CTable + 1;
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    HUF_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = HUF_initCStream(&bitC, op, (size_t)(oend-op));
      if (HUF_isError(initErr)) return 0; }

    if (dstSize < HUF_tightCompressBound(srcSize, (size_t)tableLog) || tableLog > 11)
        HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ MEM_32bits() ? 2 : 4, /* kFast */ 0, /* kLastFast */ 0);
    else {
        if (MEM_32bits()) {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10: ZSTD_FALLTHROUGH;
            case 9: ZSTD_FALLTHROUGH;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 7: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 3, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        } else {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 9:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 6, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 7, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 7:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 8, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 6: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 9, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        }
    }
    assert(bitC.ptr <= bitC.endPtr);

    return HUF_closeCStream(&bitC);
}